

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O3

void __thiscall
AssertionTest_assertNeHandlerShouldNotBeCalled_Test::TestBody
          (AssertionTest_assertNeHandlerShouldNotBeCalled_Test *this)

{
  int32_t *actual;
  bool bVar1;
  ostream *this_00;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  stringstream expectedMsg;
  AssertHelper local_1d0;
  AssertHelper local_1c8;
  Message local_1c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  undefined1 local_1b0 [16];
  internal local_1a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  ostream local_190 [112];
  ios_base local_120 [264];
  
  local_1c0.ss_.ptr_._0_4_ = 0;
  actual = &(this->super_AssertionTest).assertionHandlerCounter_;
  testing::internal::CmpHelperEQ<int,int>
            (local_1a0,"0","assertionHandlerCounter_",(int *)&local_1c0,actual);
  if (local_1a0[0] == (internal)0x0) {
    testing::Message::Message(&local_1c0);
    if (local_198.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_198.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (CONCAT44(local_1c0.ss_.ptr_._4_4_,local_1c0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_1c0.ss_.ptr_._4_4_,local_1c0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_1c0.ss_.ptr_._4_4_,local_1c0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Expected message: ",0x12);
  this_00 = (ostream *)std::ostream::operator<<(local_190,0);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  std::ostream::operator<<(this_00,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_AssertionTest).expectedStreamMessage_,(string *)&local_1c0);
  if ((undefined1 *)CONCAT44(local_1c0.ss_.ptr_._4_4_,local_1c0.ss_.ptr_._0_4_) != local_1b0) {
    operator_delete((undefined1 *)CONCAT44(local_1c0.ss_.ptr_._4_4_,local_1c0.ss_.ptr_._0_4_));
  }
  local_1d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1c0,"0","assertionHandlerCounter_",(int *)&local_1d0,actual);
  if (local_1c0.ss_.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_1b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (CONCAT44(local_1d0.data_._4_4_,local_1d0.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_1d0.data_._4_4_,local_1d0.data_._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,local_1d0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

TEST_F(AssertionTest, assertNeHandlerShouldNotBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT_NE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_NE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}